

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>::emplaceValue<QMakeInternal::QMakeBuiltin>
          (Node<ProKey,_QMakeInternal::QMakeBuiltin> *this,QMakeBuiltin *args)

{
  int iVar1;
  long lVar2;
  qsizetype qVar3;
  QArrayData *pQVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = (args->usage).d.size;
  iVar9 = args->index;
  iVar10 = args->minArgs;
  (args->usage).d.size = 0;
  iVar1 = args->maxArgs;
  uVar5 = *(undefined4 *)&(args->usage).d.d;
  uVar6 = *(undefined4 *)((long)&(args->usage).d.d + 4);
  uVar7 = *(undefined4 *)&(args->usage).d.ptr;
  uVar8 = *(undefined4 *)((long)&(args->usage).d.ptr + 4);
  (args->usage).d.d = (Data *)0x0;
  (args->usage).d.ptr = (char16_t *)0x0;
  pQVar4 = &((this->value).usage.d.d)->super_QArrayData;
  *(undefined4 *)&(this->value).usage.d.d = uVar5;
  *(undefined4 *)((long)&(this->value).usage.d.d + 4) = uVar6;
  *(undefined4 *)&(this->value).usage.d.ptr = uVar7;
  *(undefined4 *)((long)&(this->value).usage.d.ptr + 4) = uVar8;
  (this->value).usage.d.size = qVar3;
  (this->value).index = iVar9;
  (this->value).minArgs = iVar10;
  (this->value).maxArgs = iVar1;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        QArrayData::deallocate(pQVar4,2,0x10);
        return;
      }
      goto LAB_00274cd6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_00274cd6:
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }